

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O1

void __thiscall Pl_Buffer::~Pl_Buffer(Pl_Buffer *this)

{
  Members *__ptr;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Buffer_002ee2a0;
  __ptr = (this->m)._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl;
  if (__ptr != (Members *)0x0) {
    std::default_delete<Pl_Buffer::Members>::operator()
              ((default_delete<Pl_Buffer::Members> *)&this->m,__ptr);
  }
  (this->m)._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
  ._M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl = (Members *)0x0;
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ee018;
  pcVar1 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar2 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void
Pl_Buffer::write(unsigned char const* buf, size_t len)
{
    if (!len) {
        return;
    }
    m->data.append(reinterpret_cast<char const*>(buf), len);
    m->ready = false;

    if (next()) {
        next()->write(buf, len);
    }
}